

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

void poptSetExecPath(poptContext con,char *path,int allowAbsolute)

{
  size_t sVar1;
  char *pcVar2;
  poptContext con_00;
  poptArgv ppcVar3;
  size_t sVar4;
  poptOption *opt;
  poptOption *in_RCX;
  uint uVar5;
  poptArgv extraout_RDX;
  int iVar6;
  char *pcVar7;
  long *plVar8;
  poptContext con_01;
  ulong in_R8;
  undefined8 in_R9;
  ulong uVar9;
  
  pcVar7 = path;
  if (con->execPath != (char *)0x0) {
    free(con->execPath);
  }
  iVar6 = (int)pcVar7;
  con->execPath = (char *)0x0;
  sVar1 = strlen(path);
  pcVar7 = (char *)(sVar1 + 1);
  pcVar2 = (char *)malloc((size_t)pcVar7);
  if (pcVar2 == (char *)0x0) {
    poptSetExecPath_cold_1();
    con_00 = (poptContext)malloc(800);
    if (con_00 != (poptContext)0x0) {
      memset(con_00,0,800);
      con_00->os = (optionStackEntry *)con_00;
      con_00->optionStack[0].argc = iVar6;
      con_00->optionStack[0].argv = extraout_RDX;
      con_00->optionStack[0].argb = (pbm_set *)0x0;
      if ((in_R8 & 2) == 0) {
        con_00->optionStack[0].next = 1;
      }
      sVar1 = (size_t)(iVar6 + 1);
      ppcVar3 = (poptArgv)calloc(sVar1,8);
      con_00->leftovers = ppcVar3;
      con_00->allocLeftovers = iVar6 + 1;
      con_00->options = in_RCX;
      con_00->aliases = (poptItem)0x0;
      con_00->numAliases = 0;
      con_00->flags = (uint)in_R8;
      con_00->execs = (poptItem)0x0;
      con_00->numExecs = 0;
      con_00->execFail = (char *)0x0;
      uVar5 = iVar6 * 2;
      uVar9 = (ulong)uVar5;
      con_00->finalArgvAlloced = uVar5;
      plVar8 = (long *)0x8;
      ppcVar3 = (poptArgv)calloc((long)(int)uVar5,8);
      con_00->finalArgv = ppcVar3;
      con_00->execAbsolute = 1;
      con_00->arg_strip = (pbm_set *)0x0;
      pcVar2 = getenv("POSIXLY_CORRECT");
      if ((pcVar2 != (char *)0x0) || (pcVar2 = getenv("POSIX_ME_HARDER"), pcVar2 != (char *)0x0)) {
        con_00->flags = (uint)in_R8 | 4;
      }
      if (pcVar7 != (char *)0x0) {
        sVar4 = strlen(pcVar7);
        con_01 = (poptContext)(sVar4 + 1);
        pcVar2 = (char *)malloc((size_t)con_01);
        if (pcVar2 == (char *)0x0) {
          poptGetContext_cold_1();
          if (plVar8 != (long *)0x0) {
            for (; ((*plVar8 != 0 || ((char)plVar8[1] != '\0')) || (plVar8[2] != 0));
                plVar8 = plVar8 + 6) {
              opt = (poptOption *)plVar8[2];
              if (opt != (poptOption *)0x0) {
                uVar5 = _poptArgMask & *(uint *)((long)plVar8 + 0xc);
                if (uVar5 == 5) {
                  if ((int)*(uint *)((long)plVar8 + 0xc) < 0) {
                    (*(code *)opt)(con_01,0,0,0,plVar8[4],in_R9,con_00,uVar9,sVar1,pcVar7,in_RCX);
                  }
                }
                else if (uVar5 == 4) {
                  if (opt == poptHelpOptions) {
                    opt = poptHelpOptionsI18N;
                  }
                  invokeCallbacksPRE(con_01,opt);
                }
              }
            }
          }
          return;
        }
        strcpy(pcVar2,pcVar7);
        con_00->appName = pcVar2;
      }
      invokeCallbacksPRE(con_00,in_RCX);
    }
    return;
  }
  strcpy(pcVar2,path);
  con->execPath = pcVar2;
  con->execAbsolute = allowAbsolute;
  return;
}

Assistant:

void poptSetExecPath(poptContext con, const char * path, int allowAbsolute)
{
    con->execPath = _free(con->execPath);
    con->execPath = xstrdup(path);
    con->execAbsolute = allowAbsolute;
    return;
}